

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O2

void spoil_obj_desc(char *fname)

{
  _Bool _Var1;
  void *p;
  size_t sVar2;
  long lVar3;
  angband_constants *paVar4;
  uint uVar5;
  wchar_t i1;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  wchar_t e2;
  wchar_t e1;
  uint local_4fc;
  int32_t t2;
  int32_t t1;
  grouper *local_4f0;
  char *local_4e8;
  long local_4e0;
  char dam [80];
  char wgt [80];
  char buf [1024];
  
  path_build(buf,0x400,ANGBAND_DIR_USER,fname);
  fh = file_open(buf,MODE_WRITE,FTYPE_TEXT);
  if (fh != (ang_file *)0x0) {
    p = mem_zalloc((ulong)((uint)z_info->r_max * 2));
    file_putf(fh,"Spoiler File -- Basic Items (%s)\n\n\n",buildid);
    file_putf(fh,"%-51s  %7s%6s%4s%9s\n","Description","Dam/AC","Wgt","Lev","Cost");
    file_putf(fh,"%-51s  %7s%6s%4s%9s\n","----------------------------------------","------","---",
              "---","----");
    local_4e0 = 0;
    uVar5 = 0;
    do {
      local_4f0 = group_item + local_4e0;
      pcVar7 = group_item[local_4e0].name;
      if (pcVar7 != (char *)0x0) {
        uVar8 = uVar5 - 1;
        uVar11 = 0;
        local_4fc = 0;
        local_4e8 = pcVar7;
        if (0 < (int)uVar8) {
          local_4fc = uVar8;
        }
        for (; uVar11 != local_4fc; uVar11 = uVar11 + 1) {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&e1,&t1,
                      (uint)*(ushort *)((long)p + uVar6 * 2));
            kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&e2,&t2,
                      (uint)*(ushort *)((long)p + uVar6 * 2 + 2));
            if ((t2 < t1) || ((t1 == t2 && (e2 < e1)))) {
              auVar12 = ZEXT416(*(uint *)((long)p + uVar6 * 2));
              auVar12 = pshuflw(auVar12,auVar12,0xe1);
              *(int *)((long)p + uVar6 * 2) = auVar12._0_4_;
            }
          }
        }
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = 0;
        }
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          kind_info(buf,0x400,dam,0x50,wgt,0x50,&e1,&e2,(uint)*(ushort *)((long)p + uVar9 * 2));
          sVar2 = utf8_strlen(buf);
          if (sVar2 < 0x33) {
            file_putf(fh,"  %s%*s",buf,(ulong)(0x33 - (int)sVar2)," ");
          }
          else {
            if (sVar2 != 0x33) {
              utf8_clipto(buf,0x33);
            }
            file_putf(fh,"  %s",buf);
          }
          file_putf(fh,"%7s%6s%4d%9ld\n",dam,wgt);
        }
        if (local_4f0->tval == 0) goto LAB_001fda0e;
        uVar5 = 0;
        file_putf(fh,"\n\n%s\n\n",local_4e8);
      }
      lVar10 = 0x346;
      paVar4 = z_info;
      for (uVar6 = 1; uVar6 < paVar4->k_max; uVar6 = uVar6 + 1) {
        if ((*(int *)((long)k_info + lVar10 + -0x62) == local_4f0->tval) &&
           (_Var1 = flag_has_dbg(k_info->flags + lVar10 + -0x80,4,0x12,"kind->kind_flags",
                                 "KF_INSTA_ART"), paVar4 = z_info, !_Var1)) {
          lVar3 = (long)(int)uVar5;
          uVar5 = uVar5 + 1;
          *(short *)((long)p + lVar3 * 2) = (short)uVar6;
        }
        lVar10 = lVar10 + 0x2c0;
      }
      local_4e0 = local_4e0 + 1;
    } while( true );
  }
  pcVar7 = "Cannot create spoiler file.";
LAB_001fda3f:
  msg(pcVar7);
  return;
LAB_001fda0e:
  mem_free(p);
  _Var1 = file_close(fh);
  pcVar7 = "Cannot close spoiler file.";
  if (_Var1) {
    pcVar7 = "Successfully created a spoiler file.";
  }
  goto LAB_001fda3f;
}

Assistant:

void spoil_obj_desc(const char *fname)
{
	int i, k, s, t, n = 0;
	uint16_t *who;
	char buf[1024];
	char wgt[80];
	char dam[80];
	const char *format = "%-51s  %7s%6s%4s%9s\n";

	/* Open the file */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Header */
	file_putf(fh, "Spoiler File -- Basic Items (%s)\n\n\n", buildid);

	/* More Header */
	file_putf(fh, format, "Description", "Dam/AC", "Wgt", "Lev", "Cost");
	file_putf(fh, format, "----------------------------------------",
	        "------", "---", "---", "----");

	/* List the groups */
	for (i = 0; true; i++) {
		/* Write out the group title */
		if (group_item[i].name) {
			/* Hack -- bubble-sort by cost and then level */
			for (s = 0; s < n - 1; s++) {
				for (t = 0; t < n - 1; t++) {
					int i1 = t;
					int i2 = t + 1;

					int e1;
					int e2;

					int32_t t1;
					int32_t t2;

					kind_info(NULL, 0, NULL, 0, NULL, 0, &e1, &t1, who[i1]);
					kind_info(NULL, 0, NULL, 0, NULL, 0, &e2, &t2, who[i2]);

					if ((t1 > t2) || ((t1 == t2) && (e1 > e2))) {
						int tmp = who[i1];
						who[i1] = who[i2];
						who[i2] = tmp;
					}
				}
			}

			/* Spoil each item */
			for (s = 0; s < n; s++) {
				int e;
				int32_t v;
				size_t u8len;

				/* Describe the kind */
				kind_info(buf, sizeof(buf), dam, sizeof(dam), wgt, sizeof(wgt),
						  &e, &v, who[s]);

				/* Dump it */
				/*
				 * Per C99, width specifications to %s measure
				 * bytes.  To align the columns if the
				 * description has characters that take
				 * multiple bytes, handle the first column
				 * separately.  If the description has
				 * decomposed characters (ones where multiple
				 * Unicode code points combine to form one
				 * printed character), the following columns
				 * will still be out of alignment, but they'll
				 * be closer to aligned than what the standard
				 * library functions would do.
				 */
				u8len = utf8_strlen(buf);
				if (u8len < 51) {
					file_putf(fh, "  %s%*s", buf,
						(int) (51 - u8len), " ");
				} else {
					if (u8len > 51) {
						utf8_clipto(buf, 51);
					}
					file_putf(fh, "  %s", buf);
				}
				file_putf(fh, "%7s%6s%4d%9ld\n", dam, wgt, e,
						  (long)(v));
			}

			/* Start a new set */
			n = 0;

			/* Notice the end */
			if (!group_item[i].tval) break;

			/* Start a new set */
			file_putf(fh, "\n\n%s\n\n", group_item[i].name);
		}

		/* Get legal item types */
		for (k = 1; k < z_info->k_max; k++) {
			struct object_kind *kind = &k_info[k];

			/* Skip wrong tvals */
			if (kind->tval != group_item[i].tval) continue;

			/* Hack -- Skip instant-artifacts */
			if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

			/* Save the index */
			who[n++] = k;
		}
	}

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Message */
	msg("Successfully created a spoiler file.");
}